

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyHelpers.cpp
# Opt level: O1

void btSoftBodyHelpers::DrawFrame(btSoftBody *psb,btIDebugDraw *idraw)

{
  float fVar1;
  btVector3 *pbVar2;
  long lVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  btVector3 x;
  btVector3 com;
  undefined1 auVar21 [16];
  btVector3 local_b8;
  btVector3 local_a8;
  float local_98;
  float fStack_94;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if ((psb->m_pose).m_bframe == true) {
    local_88 = *(undefined8 *)(psb->m_pose).m_com.m_floats;
    uStack_80 = *(undefined8 *)((psb->m_pose).m_com.m_floats + 2);
    fVar5 = (psb->m_pose).m_scl.m_el[0].m_floats[0];
    fVar6 = (psb->m_pose).m_scl.m_el[1].m_floats[0];
    fVar7 = (psb->m_pose).m_scl.m_el[2].m_floats[0];
    fVar8 = (psb->m_pose).m_scl.m_el[0].m_floats[1];
    fVar10 = (psb->m_pose).m_scl.m_el[1].m_floats[1];
    fVar14 = (psb->m_pose).m_rot.m_el[1].m_floats[1];
    fVar16 = (psb->m_pose).m_rot.m_el[0].m_floats[0];
    fVar9 = (psb->m_pose).m_rot.m_el[0].m_floats[1];
    fVar11 = (psb->m_pose).m_rot.m_el[0].m_floats[2];
    fVar12 = (psb->m_pose).m_rot.m_el[1].m_floats[0];
    fVar15 = (psb->m_pose).m_rot.m_el[1].m_floats[2];
    fVar17 = fVar7 * fVar11 + fVar5 * fVar16 + fVar9 * fVar6;
    fVar19 = fVar7 * fVar15 + fVar5 * fVar12 + fVar14 * fVar6;
    fVar13 = (psb->m_pose).m_scl.m_el[2].m_floats[1];
    fVar18 = (psb->m_pose).m_scl.m_el[0].m_floats[2];
    fVar20 = (psb->m_pose).m_scl.m_el[1].m_floats[2];
    fVar1 = (psb->m_pose).m_scl.m_el[2].m_floats[2];
    local_98 = fVar13 * fVar11 + fVar8 * fVar16 + fVar10 * fVar9;
    fStack_94 = fVar15 * fVar13 + fVar12 * fVar8 + fVar14 * fVar10;
    fVar11 = fVar1 * fVar11 + fVar18 * fVar16 + fVar20 * fVar9;
    fVar12 = fVar1 * fVar15 + fVar18 * fVar12 + fVar14 * fVar20;
    fVar14 = (psb->m_pose).m_rot.m_el[2].m_floats[0];
    fVar16 = (psb->m_pose).m_rot.m_el[2].m_floats[1];
    fVar9 = (psb->m_pose).m_rot.m_el[2].m_floats[2];
    fVar6 = fVar7 * fVar9 + fVar5 * fVar14 + fVar6 * fVar16;
    fVar15 = fVar13 * fVar9 + fVar8 * fVar14 + fVar10 * fVar16;
    fVar16 = fVar1 * fVar9 + fVar18 * fVar14 + fVar20 * fVar16;
    fVar14 = fVar6 + fVar15 * 0.0 + fVar16 * 0.0;
    fVar10 = fVar6 * 0.0 + fVar15 + fVar16 * 0.0;
    fVar7 = fVar17 + local_98 * 0.0 + fVar11 * 0.0;
    fVar8 = fVar19 + fStack_94 * 0.0 + fVar12 * 0.0;
    fVar5 = fVar14 * fVar14 + fVar7 * fVar7 + fVar8 * fVar8;
    local_48 = ZEXT416((uint)fVar6);
    local_58 = ZEXT416((uint)fVar15);
    uStack_90 = 0;
    local_78 = CONCAT44(fStack_94 * 0.0,local_98 * 0.0);
    uStack_70 = 0;
    if (fVar5 < 0.0) {
      fVar5 = sqrtf(fVar5);
    }
    else {
      fVar5 = SQRT(fVar5);
    }
    fVar9 = fVar6 * 0.0 + fVar15 * 0.0 + fVar16;
    fVar5 = 1.0 / fVar5;
    fVar7 = fVar7 * fVar5;
    fVar8 = fVar8 * fVar5;
    fVar15 = fVar11 * 0.0 + fVar17 * 0.0 + local_98;
    fVar13 = fVar12 * 0.0 + fVar19 * 0.0 + fStack_94;
    fVar6 = fVar10 * fVar10 + fVar15 * fVar15 + fVar13 * fVar13;
    if (fVar6 < 0.0) {
      fVar6 = sqrtf(fVar6);
    }
    else {
      fVar6 = SQRT(fVar6);
    }
    fVar7 = fVar7 * 10.0;
    fVar8 = fVar8 * 10.0;
    fVar6 = 1.0 / fVar6;
    local_68 = ZEXT416((uint)(fVar6 * fVar10 * 10.0));
    fVar18 = fVar17 * 0.0 + (float)local_78 + fVar11;
    fVar20 = fVar19 * 0.0 + local_78._4_4_ + fVar12;
    fVar10 = fVar9 * fVar9 + fVar18 * fVar18 + fVar20 * fVar20;
    if (fVar10 < 0.0) {
      fVar10 = sqrtf(fVar10);
    }
    else {
      fVar10 = SQRT(fVar10);
    }
    fVar10 = 1.0 / fVar10;
    auVar21 = ZEXT416((uint)(fVar10 * fVar9));
    local_a8.m_floats[1] = fVar8 + (float)((ulong)local_88 >> 0x20);
    local_a8.m_floats[0] = fVar7 + (float)local_88;
    local_a8.m_floats[2] = fVar5 * fVar14 * 10.0 + (float)uStack_80;
    local_a8.m_floats[3] = 0.0;
    local_b8.m_floats[0] = 1.0;
    local_b8.m_floats[1] = 0.0;
    local_b8.m_floats[2] = 0.0;
    local_b8.m_floats[3] = 0.0;
    (*idraw->_vptr_btIDebugDraw[4])(idraw,&local_88,&local_a8,&local_b8,in_R8,in_R9,auVar21);
    fVar5 = auVar21._0_4_;
    local_a8.m_floats[1] = fVar13 * fVar6 * 10.0 + (float)((ulong)local_88 >> 0x20);
    local_a8.m_floats[0] = fVar15 * fVar6 * 10.0 + (float)local_88;
    local_a8.m_floats[2] = (float)local_68._0_4_ + (float)uStack_80;
    local_a8.m_floats[3] = 0.0;
    local_b8.m_floats[0] = 0.0;
    local_b8.m_floats[1] = 1.0;
    local_b8.m_floats[2] = 0.0;
    local_b8.m_floats[3] = 0.0;
    (*idraw->_vptr_btIDebugDraw[4])(idraw,&local_88,&local_a8,&local_b8);
    local_a8.m_floats[1] = (float)((ulong)local_88 >> 0x20) + fVar20 * fVar10 * 10.0;
    local_a8.m_floats[0] = (float)local_88 + fVar18 * fVar10 * 10.0;
    local_a8.m_floats[2] = fVar5 * 10.0 + (float)uStack_80;
    local_a8.m_floats[3] = 0.0;
    local_b8.m_floats[0] = 0.0;
    local_b8.m_floats[1] = 0.0;
    local_b8.m_floats[2] = 1.0;
    local_b8.m_floats[3] = 0.0;
    (*idraw->_vptr_btIDebugDraw[4])(idraw,&local_88,&local_a8,&local_b8);
    if (0 < (psb->m_pose).m_pos.m_size) {
      lVar4 = 8;
      lVar3 = 0;
      do {
        pbVar2 = (psb->m_pose).m_pos.m_data;
        fVar5 = *(float *)((long)pbVar2->m_floats + lVar4 + -8);
        fVar6 = *(float *)((long)pbVar2->m_floats + lVar4 + -4);
        fVar7 = *(float *)((long)pbVar2->m_floats + lVar4);
        local_a8.m_floats[1] =
             (float)((ulong)local_88 >> 0x20) + fVar7 * fVar12 + fVar5 * fVar19 + fVar6 * fStack_94;
        local_a8.m_floats[0] = (float)local_88 + fVar7 * fVar11 + fVar5 * fVar17 + fVar6 * local_98;
        local_a8.m_floats[2] =
             fVar16 * fVar7 + (float)local_48._0_4_ * fVar5 + (float)local_58._0_4_ * fVar6 +
             (float)uStack_80;
        local_a8.m_floats[3] = 0.0;
        local_b8.m_floats[0] = 1.0;
        local_b8.m_floats[1] = 0.0;
        local_b8.m_floats[2] = 1.0;
        local_b8.m_floats[3] = 0.0;
        drawVertex(idraw,&local_a8,0.1,&local_b8);
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + 0x10;
      } while (lVar3 < (psb->m_pose).m_pos.m_size);
    }
  }
  return;
}

Assistant:

void			btSoftBodyHelpers::DrawFrame(		btSoftBody* psb,
											 btIDebugDraw* idraw)
{
	if(psb->m_pose.m_bframe)
	{
		static const btScalar	ascl=10;
		static const btScalar	nscl=(btScalar)0.1;
		const btVector3			com=psb->m_pose.m_com;
		const btMatrix3x3		trs=psb->m_pose.m_rot*psb->m_pose.m_scl;
		const btVector3			Xaxis=(trs*btVector3(1,0,0)).normalized();
		const btVector3			Yaxis=(trs*btVector3(0,1,0)).normalized();
		const btVector3			Zaxis=(trs*btVector3(0,0,1)).normalized();
		idraw->drawLine(com,com+Xaxis*ascl,btVector3(1,0,0));
		idraw->drawLine(com,com+Yaxis*ascl,btVector3(0,1,0));
		idraw->drawLine(com,com+Zaxis*ascl,btVector3(0,0,1));
		for(int i=0;i<psb->m_pose.m_pos.size();++i)
		{
			const btVector3	x=com+trs*psb->m_pose.m_pos[i];
			drawVertex(idraw,x,nscl,btVector3(1,0,1));
		}
	}
}